

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_disconnect_with_undo(_glist *x,t_float index1,t_float outno,t_float index2,t_float inno)

{
  int *data;
  
  canvas_disconnect(x,index1,outno,index2,inno);
  data = (int *)getbytes(0x10);
  *data = (int)index1;
  data[1] = (int)outno;
  data[2] = (int)index2;
  data[3] = (int)inno;
  canvas_undo_add(x,UNDO_DISCONNECT,"disconnect",data);
  return;
}

Assistant:

static void canvas_disconnect_with_undo(t_canvas *x,
    t_float index1, t_float outno, t_float index2, t_float inno)
{
    canvas_disconnect(x, index1, outno, index2, inno);
    canvas_undo_add(x, UNDO_DISCONNECT, "disconnect", canvas_undo_set_disconnect(x,
        index1, outno, index2, inno));
}